

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QStringList *
QFileDialog::getOpenFileNames
          (QStringList *__return_storage_ptr__,QWidget *parent,QString *caption,QString *dir,
          QString *filter,QString *selectedFilter,Options options)

{
  long lVar1;
  QUrl *url;
  QUrl *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QUrl> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)0x0;
  local_90.d = (Data *)0x0;
  local_90.ptr = (char16_t *)0x0;
  local_78.ptr = (QUrl *)0x66b38e;
  local_90.size = 0;
  local_78.size = 4;
  QList<QString>::QList<QString,void>((QList<QString> *)&local_58,(QString *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::fromLocalFile((QString *)&local_90);
  getOpenFileUrls((QList<QUrl> *)&local_78,parent,caption,(QUrl *)&local_90,filter,selectedFilter,
                  options,(QStringList *)&local_58);
  QUrl::~QUrl((QUrl *)&local_90);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QString>::reserve(__return_storage_ptr__,local_78.size);
  pQVar2 = local_78.ptr;
  for (lVar1 = local_78.size << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    QUrl::toString(&local_90,pQVar2,0x200);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    pQVar2 = pQVar2 + 1;
  }
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QFileDialog::getOpenFileNames(QWidget *parent,
                                          const QString &caption,
                                          const QString &dir,
                                          const QString &filter,
                                          QString *selectedFilter,
                                          Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QList<QUrl> selectedUrls = getOpenFileUrls(parent, caption, QUrl::fromLocalFile(dir),
                                                     filter, selectedFilter, options, schemes);
    QStringList fileNames;
    fileNames.reserve(selectedUrls.size());
    for (const QUrl &url : selectedUrls)
        fileNames.append(url.toString(QUrl::PreferLocalFile));
    return fileNames;
}